

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

Vec_Int_t * Lms_GiaFindNonRedundantCos(Lms_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  Vec_Wrd_t *__ptr;
  Vec_Int_t *__ptr_00;
  Vec_Int_t *p_00;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  __ptr = Lms_GiaDelays(p->pGia);
  __ptr_00 = Lms_GiaCollectUsefulCos(p);
  iVar1 = __ptr_00->nSize;
  lVar13 = (long)iVar1;
  if (0 < lVar13) {
    piVar8 = __ptr_00->pArray;
    lVar10 = 1;
    lVar11 = 0;
    do {
      iVar2 = piVar8[lVar11];
      if (-1 < (long)iVar2) {
        iVar3 = __ptr->nSize;
        if (iVar3 <= iVar2) {
LAB_002fe0de:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        pwVar5 = __ptr->pArray;
        uVar6 = pwVar5[iVar2];
        if (uVar6 == 0) {
          __assert_fail("D1 > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcRec3.c"
                        ,0x4de,"Vec_Int_t *Lms_GiaFindNonRedundantCos(Lms_Man_t *)");
        }
        lVar12 = lVar10;
        if (lVar11 + 1 < lVar13) {
          do {
            uVar4 = piVar8[lVar12];
            if ((ulong)uVar4 != 0xfffffffe) {
              if (uVar4 == 0xffffffff) break;
              if (((int)uVar4 < 0) || (iVar3 <= (int)uVar4)) goto LAB_002fe0de;
              uVar7 = pwVar5[uVar4];
              if (uVar7 == 0) {
                __assert_fail("D2 > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcRec3.c"
                              ,0x4e6,"Vec_Int_t *Lms_GiaFindNonRedundantCos(Lms_Man_t *)");
              }
              lVar14 = (long)p->pGia->vCis->nSize;
              if (0 < lVar14) {
                lVar14 = lVar14 * 4;
                lVar9 = 0;
                do {
                  if (lVar9 == 0x40) goto LAB_002fe0bf;
                  if (((uint)(uVar7 >> ((byte)lVar9 & 0x3f)) & 0xf) <
                      ((uint)(uVar6 >> ((byte)lVar9 & 0x3f)) & 0xf)) {
                    lVar9 = 0;
                    goto LAB_002fdfe7;
                  }
                  lVar9 = lVar9 + 4;
                } while (lVar14 != lVar9);
              }
              piVar8[lVar12] = -2;
            }
LAB_002fdfd7:
            lVar12 = lVar12 + 1;
          } while (lVar12 != lVar13);
        }
      }
LAB_002fe024:
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar11 != lVar13);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(4000);
  p_00->pArray = piVar8;
  piVar8 = __ptr_00->pArray;
  if (iVar1 < 1) {
    if (piVar8 == (int *)0x0) goto LAB_002fe08d;
  }
  else {
    lVar10 = 0;
    do {
      if (-1 < piVar8[lVar10]) {
        Vec_IntPush(p_00,piVar8[lVar10]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar13 != lVar10);
  }
  free(piVar8);
LAB_002fe08d:
  free(__ptr_00);
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return p_00;
LAB_002fdfe7:
  if (lVar9 == 0x40) {
LAB_002fe0bf:
    __assert_fail("v >= 0 && v < LMS_VAR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcRec3.c"
                  ,0x71,"int Lms_DelayGet(word, int)");
  }
  if (((uint)(uVar6 >> ((byte)lVar9 & 0x3f)) & 0xf) < ((uint)(uVar7 >> ((byte)lVar9 & 0x3f)) & 0xf))
  goto LAB_002fdfd7;
  lVar9 = lVar9 + 4;
  if (lVar14 == lVar9) {
    piVar8[lVar11] = -2;
    goto LAB_002fe024;
  }
  goto LAB_002fdfe7;
}

Assistant:

Vec_Int_t * Lms_GiaFindNonRedundantCos( Lms_Man_t * p )
{
    Vec_Int_t * vRemain;
    Vec_Int_t * vUseful;
    Vec_Wrd_t * vDelays;
    int i, k, EntryI, EntryK;
    word D1, D2;
    vDelays = Lms_GiaDelays( p->pGia );
    vUseful = Lms_GiaCollectUsefulCos( p );
    Vec_IntForEachEntry( vUseful, EntryI, i )
    {
        if ( EntryI < 0 )
            continue;
        D1 = Vec_WrdEntry(vDelays, EntryI);
        assert( D1 > 0 );
        Vec_IntForEachEntryStart( vUseful, EntryK, k, i+1 )
        {
            if ( EntryK == -1 )
                break;
            if ( EntryK == -2 )
                continue;
            D2 = Vec_WrdEntry(vDelays, EntryK);
            assert( D2 > 0 );
            if ( Lms_DelayDom(D1, D2, Gia_ManCiNum(p->pGia)) ) // D1 dominate D2
            {
                Vec_IntWriteEntry( vUseful, k, -2 );
                continue;
            }
            if ( Lms_DelayDom(D2, D1, Gia_ManCiNum(p->pGia)) ) // D2 dominate D1
            {
                Vec_IntWriteEntry( vUseful, i, -2 );
                break;
            }
        }
    }

    vRemain = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vUseful, EntryI, i )
        if ( EntryI >= 0 )
            Vec_IntPush( vRemain, EntryI );
    Vec_IntFree( vUseful );
    Vec_WrdFree( vDelays );
    return vRemain;
}